

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O0

void __thiscall
NimState::
do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
          (NimState *this,
          mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *engine)

{
  int *piVar1;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_RDI;
  uniform_int_distribution<int> moves;
  int max;
  int in_stack_00000234;
  char *in_stack_00000238;
  char *in_stack_00000240;
  NimState *in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  
  if (*(int *)((long)in_RDI->_M_x + 4) < 1) {
    MCTS::assertion_failed(in_stack_00000240,in_stack_00000238,in_stack_00000234);
  }
  check_invariant(in_stack_ffffffffffffffe0);
  local_18 = 3;
  piVar1 = std::min<int>(&local_18,(int *)((long)in_RDI->_M_x + 4));
  local_14 = *piVar1;
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20)
             ,(int)in_RDI);
  std::uniform_int_distribution<int>::operator()
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffffe0,in_RDI);
  do_move(in_stack_ffffffffffffffe0,(Move)((ulong)in_RDI >> 0x20));
  check_invariant(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void do_random_move(RandomEngine* engine)
	{
		attest(chips > 0);
		check_invariant();

		int max = std::min(3, chips);
		std::uniform_int_distribution<Move> moves(1, max);
		do_move(moves(*engine));

		check_invariant();
	}